

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O0

string * __thiscall
cmOutputConverter::ConvertToOutputFormat
          (string *__return_storage_ptr__,cmOutputConverter *this,string *source,OutputFormat output
          )

{
  string local_98;
  string local_78;
  string local_48;
  undefined1 local_25;
  OutputFormat local_24;
  string *psStack_20;
  OutputFormat output_local;
  string *source_local;
  cmOutputConverter *this_local;
  string *result;
  
  local_25 = 0;
  local_24 = output;
  psStack_20 = source;
  source_local = (string *)this;
  this_local = (cmOutputConverter *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)source);
  if ((local_24 == SHELL) || (local_24 == WATCOMQUOTE)) {
    ConvertDirectorySeparatorsForShell(&local_48,this,psStack_20);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    EscapeForShell(&local_78,this,__return_storage_ptr__,true,false,local_24 == WATCOMQUOTE);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  else if (local_24 == RESPONSE) {
    EscapeForShell(&local_98,this,__return_storage_ptr__,false,false,false);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::ConvertToOutputFormat(const std::string& source,
                                                     OutputFormat output) const
{
  std::string result = source;
  // Convert it to an output path.
  if (output == SHELL || output == WATCOMQUOTE) {
    result = this->ConvertDirectorySeparatorsForShell(source);
    result = this->EscapeForShell(result, true, false, output == WATCOMQUOTE);
  } else if (output == RESPONSE) {
    result = this->EscapeForShell(result, false, false, false);
  }
  return result;
}